

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_symbols.hpp
# Opt level: O1

void __thiscall
ELFIO::symbol_section_accessor_template<ELFIO::section>::find_hash_section
          (symbol_section_accessor_template<ELFIO::section> *this)

{
  elfio *peVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  __uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_> _Var7;
  ulong uVar8;
  
  peVar1 = (this->elf_file->sections).parent;
  uVar6 = (long)(peVar1->sections_).
                super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(peVar1->sections_).
                super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar6 & 0x7fff8) != 0) {
    uVar8 = 0;
    do {
      peVar1 = (this->elf_file->sections).parent;
      puVar2 = (peVar1->sections_).
               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar8 < (ulong)((long)(peVar1->sections_).
                                super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
        _Var7._M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
        super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl =
             *(tuple<ELFIO::section_*,_std::default_delete<ELFIO::section>_> *)&puVar2[uVar8]._M_t;
      }
      else {
        _Var7._M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
        super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl =
             (tuple<ELFIO::section_*,_std::default_delete<ELFIO::section>_>)
             (_Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>)0x0;
      }
      uVar3 = (**(code **)(*(long *)_Var7._M_t.
                                    super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                    .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl +
                          0x58))(_Var7._M_t.
                                 super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                 .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl);
      uVar4 = (*this->symbol_section->_vptr_section[2])();
      if ((uVar3 == (uVar4 & 0xffff)) &&
         (((iVar5 = (**(code **)(*(long *)_Var7._M_t.
                                          super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                          .super__Head_base<0UL,_ELFIO::section_*,_false>.
                                          _M_head_impl + 0x28))
                              (_Var7._M_t.
                               super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                               .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl),
           iVar5 == 5 ||
           (iVar5 = (**(code **)(*(long *)_Var7._M_t.
                                          super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                          .super__Head_base<0UL,_ELFIO::section_*,_false>.
                                          _M_head_impl + 0x28))
                              (_Var7._M_t.
                               super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                               .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl),
           iVar5 == 0x6ffffff6)) ||
          (iVar5 = (**(code **)(*(long *)_Var7._M_t.
                                         super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                         .super__Head_base<0UL,_ELFIO::section_*,_false>.
                                         _M_head_impl + 0x28))
                             (_Var7._M_t.
                              super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                              .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl),
          iVar5 == 0x6ffffef5)))) {
        this->hash_section =
             (section *)
             _Var7._M_t.
             super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
             super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl;
        this->hash_section_index = (Elf_Half)uVar8;
        return;
      }
      uVar8 = uVar8 + 1;
    } while (((uint)uVar6 >> 3 & 0xffff) != uVar8);
  }
  return;
}

Assistant:

void find_hash_section()
    {
        Elf_Half nSecNo = elf_file.sections.size();
        for ( Elf_Half i = 0; i < nSecNo; ++i ) {
            const section* sec = elf_file.sections[i];
            if ( sec->get_link() == symbol_section->get_index() &&
                 ( sec->get_type() == SHT_HASH ||
                   sec->get_type() == SHT_GNU_HASH ||
                   sec->get_type() == DT_GNU_HASH ) ) {
                hash_section       = sec;
                hash_section_index = i;
                break;
            }
        }
    }